

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::
initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper::
~initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper
          (initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper
           *this)

{
  ~initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper
            ((initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper
              *)&this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNums) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  object->setPersistMessages(false);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  object->setNextSenderMsgSeqNum(5);

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 10);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(5, object->getExpectedSenderNum());
  CHECK_EQUAL(2, object->getExpectedTargetNum());

}